

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStringTemplateCallsiteConstant
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,Var var)

{
  uint32 uVar1;
  ScriptContext *scriptContext;
  Var pvVar2;
  JavascriptArray *this_00;
  uint local_4c;
  uint32 i_1;
  ES5Array *rawArray;
  Var rawVar;
  uint32 i;
  uint32 size;
  Var element;
  ES5Array *callsite;
  Var var_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  callsite = (ES5Array *)var;
  var_local = builder;
  builder_local = (BufferBuilderList *)this;
  element = VarTo<Js::ES5Array>(var);
  pvVar2 = var_local;
  _i = (Var)0x0;
  uVar1 = ArrayObject::GetLength((ArrayObject *)element);
  rawVar._4_4_ = PrependInt32(this,(BufferBuilderList *)pvVar2,
                              L"String Template Callsite Constant String Count",uVar1,
                              (BufferBuilderInt32 **)0x0);
  rawVar._0_4_ = 0;
  while( true ) {
    uVar1 = ArrayObject::GetLength((ArrayObject *)element);
    pvVar2 = element;
    if (uVar1 <= (uint)rawVar) break;
    Js::JavascriptArray::DirectGetItemAt<void*>((JavascriptArray *)element,(uint)rawVar,(void **)&i)
    ;
    uVar1 = PrependStringConstant(this,(BufferBuilderList *)var_local,_i);
    rawVar._4_4_ = uVar1 + rawVar._4_4_;
    rawVar._0_4_ = (uint)rawVar + 1;
  }
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)element);
  pvVar2 = Js::JavascriptOperators::OP_GetProperty(pvVar2,0x12a,scriptContext);
  this_00 = &VarTo<Js::ES5Array>(pvVar2)->super_JavascriptArray;
  local_4c = 0;
  while( true ) {
    uVar1 = ArrayObject::GetLength(&this_00->super_ArrayObject);
    if (uVar1 <= local_4c) break;
    Js::JavascriptArray::DirectGetItemAt<void*>(this_00,local_4c,(void **)&i);
    uVar1 = PrependStringConstant(this,(BufferBuilderList *)var_local,_i);
    rawVar._4_4_ = uVar1 + rawVar._4_4_;
    local_4c = local_4c + 1;
  }
  return rawVar._4_4_;
}

Assistant:

uint32 PrependStringTemplateCallsiteConstant(BufferBuilderList & builder, Var var)
    {
        ES5Array* callsite = VarTo<ES5Array>(var);
        Var element = nullptr;
        auto size = PrependInt32(builder, _u("String Template Callsite Constant String Count"), (int)callsite->GetLength());

        for (uint32 i = 0; i < callsite->GetLength(); i++)
        {
            callsite->DirectGetItemAt(i, &element);
            size += PrependStringConstant(builder, element);
        }

        Var rawVar = JavascriptOperators::OP_GetProperty(callsite, Js::PropertyIds::raw, callsite->GetScriptContext());
        ES5Array* rawArray = VarTo<ES5Array>(rawVar);

        for (uint32 i = 0; i < rawArray->GetLength(); i++)
        {
            rawArray->DirectGetItemAt(i, &element);
            size += PrependStringConstant(builder, element);
        }

        return size;
    }